

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O0

double __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::log
          (ansicolor_sink<spdlog::details::console_mutex> *this,double __x)

{
  pointer pfVar1;
  long in_RSI;
  double extraout_XMM0_Qa;
  memory_buf_t formatted;
  lock_guard<std::mutex> lock;
  allocator<char> *in_stack_fffffffffffffe78;
  memory_buf_t *in_stack_fffffffffffffe80;
  memory_buf_t *in_stack_fffffffffffffe88;
  memory_buf_t *formatted_00;
  ansicolor_sink<spdlog::details::console_mutex> *in_stack_fffffffffffffe90;
  ansicolor_sink<spdlog::details::console_mutex> *this_00;
  allocator<char> local_139;
  memory_buf_t local_138;
  long local_10;
  ansicolor_sink<spdlog::details::console_mutex> *local_8;
  
  local_10 = in_RSI;
  local_8 = this;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffe80,
             (mutex_type *)in_stack_fffffffffffffe78);
  std::allocator<char>::allocator();
  ::fmt::v6::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  std::allocator<char>::~allocator(&local_139);
  pfVar1 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                     ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                      0x20a113);
  (*pfVar1->_vptr_formatter[2])(pfVar1,local_10,&local_138);
  if (((this->should_do_colors_ & 1U) == 0) ||
     (*(ulong *)(local_10 + 0x30) <= *(ulong *)(local_10 + 0x28))) {
    in_stack_fffffffffffffe80 = &local_138;
    ::fmt::v6::internal::buffer<char>::size((buffer<char> *)in_stack_fffffffffffffe80);
    print_range_(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (size_t)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
  }
  else {
    print_range_(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (size_t)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
    std::
    unordered_map<spdlog::level::level_enum,_fmt::v6::basic_string_view<char>,_std::hash<int>,_std::equal_to<spdlog::level::level_enum>,_std::allocator<std::pair<const_spdlog::level::level_enum,_fmt::v6::basic_string_view<char>_>_>_>
    ::operator[]((unordered_map<spdlog::level::level_enum,_fmt::v6::basic_string_view<char>,_std::hash<int>,_std::equal_to<spdlog::level::level_enum>,_std::allocator<std::pair<const_spdlog::level::level_enum,_fmt::v6::basic_string_view<char>_>_>_>
                  *)in_stack_fffffffffffffe80,(key_type *)in_stack_fffffffffffffe78);
    print_ccode_(in_stack_fffffffffffffe90,(string_view_t *)in_stack_fffffffffffffe88);
    print_range_(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (size_t)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
    print_ccode_(in_stack_fffffffffffffe90,(string_view_t *)in_stack_fffffffffffffe88);
    this_00 = *(ansicolor_sink<spdlog::details::console_mutex> **)(local_10 + 0x30);
    formatted_00 = &local_138;
    ::fmt::v6::internal::buffer<char>::size((buffer<char> *)formatted_00);
    print_range_(this_00,formatted_00,(size_t)in_stack_fffffffffffffe80,
                 (size_t)in_stack_fffffffffffffe78);
  }
  fflush((FILE *)this->target_file_);
  ::fmt::v6::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
            (in_stack_fffffffffffffe80);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x20a2aa);
  return extraout_XMM0_Qa;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::log(const details::log_msg &msg)
{
    // Wrap the originally formatted message in color codes.
    // If color is not supported in the terminal, log as is instead.
    std::lock_guard<mutex_t> lock(mutex_);

    memory_buf_t formatted;
    formatter_->format(msg, formatted);
    if (should_do_colors_ && msg.color_range_end > msg.color_range_start)
    {
        // before color range
        print_range_(formatted, 0, msg.color_range_start);
        // in color range
        print_ccode_(colors_[msg.level]);
        print_range_(formatted, msg.color_range_start, msg.color_range_end);
        print_ccode_(reset);
        // after color range
        print_range_(formatted, msg.color_range_end, formatted.size());
    }
    else // no color
    {
        print_range_(formatted, 0, formatted.size());
    }
    fflush(target_file_);
}